

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O3

CScript * BuildScript<CScript,std::vector<unsigned_char,std::allocator<unsigned_char>>,opcodetype>
                    (CScript *__return_storage_ptr__,CScript *inputs,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *inputs_1,
                    opcodetype *inputs_2)

{
  size_type sVar1;
  long lVar2;
  pointer pbVar3;
  pointer puVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar3 = (inputs_1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (inputs_1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar1 = (inputs->super_CScriptBase)._size;
  pcVar5 = (inputs->super_CScriptBase)._union.indirect_contents.indirect;
  uVar6 = *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 8);
  uVar7 = *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 0x14);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0xc) =
       *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 0xc);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x14) = uVar7;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = pcVar5;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = uVar6;
  (__return_storage_ptr__->super_CScriptBase)._size = sVar1;
  (inputs->super_CScriptBase)._size = 0;
  b._M_extent._M_extent_value = (long)puVar4 - (long)pbVar3;
  b._M_ptr = pbVar3;
  CScript::operator<<(__return_storage_ptr__,b);
  CScript::operator<<(__return_storage_ptr__,*inputs_2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}